

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListReader * __thiscall
capnp::_::PointerReader::getListAnySize
          (ListReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  ushort uVar1;
  unsigned_short uVar2;
  StructDataBitCount SVar3;
  word *pwVar4;
  CapTableReader *pCVar5;
  Arena *pAVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar10;
  ElementSize EVar11;
  ulong uVar12;
  uint uVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  WirePointer *pWVar19;
  char *pcVar20;
  DebugComparison<int_&,_int> *this_00;
  bool bVar21;
  Exception *local_80;
  int local_74;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  Fault f_3;
  
  pWVar14 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar14 = this->pointer;
  }
  local_80 = (Exception *)this->segment;
  local_74 = this->nestingLimit;
  pWVar15 = pWVar14 + 1;
  iVar8 = (int)*(uint64_t *)&(pWVar14->offsetAndKind).value;
  lVar16 = (long)(iVar8 >> 2);
  if (local_80 == (Exception *)0x0) {
    pWVar19 = pWVar15 + lVar16;
  }
  else {
    pwVar4 = ((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr;
    pWVar19 = (WirePointer *)(pwVar4 + (long)local_80->file);
    if (((long)pwVar4 - (long)pWVar15 >> 3 <= lVar16) &&
       (lVar16 <= (long)pWVar19 - (long)pWVar15 >> 3)) {
      pWVar19 = pWVar15 + lVar16;
    }
  }
  pCVar5 = this->capTable;
  if (iVar8 != 0 || (pWVar14->field_1).upper32Bits != 0) goto LAB_0017dae9;
LAB_0017daaf:
  do {
    pWVar14 = (WirePointer *)defaultValue;
    if ((pWVar14 == (WirePointer *)0x0) ||
       (iVar8 = (int)*(uint64_t *)&(pWVar14->offsetAndKind).value,
       (pWVar14->field_1).upper32Bits == 0 && iVar8 == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentReader *)0x0;
      __return_storage_ptr__->capTable = (CapTableReader *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
      __return_storage_ptr__->nestingLimit = 0x7fffffff;
      return __return_storage_ptr__;
    }
    local_80 = (Exception *)0x0;
    pWVar19 = pWVar14 + (long)(iVar8 >> 2) + 1;
    defaultValue = (word *)0x0;
LAB_0017dae9:
    _kjCondition.left = &local_74;
    _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = 0 < local_74;
    if (local_74 < 1) {
      this_00 = (DebugComparison<int_&,_int> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e6,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      goto LAB_0017e197;
    }
    pWVar15 = pWVar14;
    if ((local_80 == (Exception *)0x0) || ((*(uint64_t *)&(pWVar14->offsetAndKind).value & 3) != 2))
    goto LAB_0017de1d;
    pAVar6 = (Arena *)(local_80->ownFile).content.ptr;
    iVar8 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)(pWVar14->field_1).upper32Bits);
    local_80 = (Exception *)CONCAT44(extraout_var,iVar8);
    _kjCondition.left = (int *)&local_80;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_80 != (Exception *)0x0;
    if (local_80 == (Exception *)0x0) {
      this_00 = (DebugComparison<int_&,_int> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      goto LAB_0017e197;
    }
    uVar9 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
    pcVar20 = (char *)(ulong)(uVar9 >> 3);
    pcVar17 = local_80->file;
    if ((long)pcVar17 < (long)pcVar20) {
      pcVar20 = pcVar17;
    }
    uVar12 = 2 - (ulong)((uVar9 & 4) == 0);
    if (pcVar17 < pcVar20 + uVar12) {
LAB_0017dbab:
      f.exception = f.exception & 0xffffffffffffff00;
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&f,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
      goto LAB_0017e197;
    }
    pWVar15 = (WirePointer *)
              (((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr +
              (long)pcVar20);
    uVar18 = (*(ReadLimiter **)&local_80->line)->limit;
    if (uVar18 < uVar12) {
      (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
      goto LAB_0017dbab;
    }
    (*(ReadLimiter **)&local_80->line)->limit = uVar18 - uVar12;
    if ((*(uint64_t *)&(pWVar14->offsetAndKind).value & 4) == 0) {
      pWVar14 = pWVar15 + 1;
      uVar9 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
      lVar16 = (long)((int)uVar9 >> 2);
      if ((local_80 != (Exception *)0x0) &&
         ((pwVar4 = ((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr,
          pWVar19 = (WirePointer *)(pwVar4 + (long)local_80->file),
          lVar16 < (long)pwVar4 - (long)pWVar14 >> 3 ||
          ((long)pWVar19 - (long)pWVar14 >> 3 < lVar16)))) goto LAB_0017de1d;
      pWVar19 = pWVar14 + lVar16;
      goto LAB_0017de2c;
    }
    pAVar6 = (Arena *)(local_80->ownFile).content.ptr;
    iVar8 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)(pWVar15->field_1).upper32Bits);
    f.exception = (Exception *)CONCAT44(extraout_var_00,iVar8);
    _kjCondition.left = (int *)&f;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = f.exception != (Exception *)0x0;
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                (&f_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x25f,FAILED,"newSegment != nullptr",
                 "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [56])"Message contains double-far pointer to unknown segment.");
    }
    else {
      uVar9 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value & 3;
      _kjCondition.left = (int *)CONCAT44(2,uVar9);
      _kjCondition._8_8_ = (long)"() {\n  return which() == " + 0x15;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = (size_t)(uVar9 == 2);
      if (uVar9 == 2) {
        pcVar17 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar15->offsetAndKind).value >> 3);
        if ((long)(f.exception)->file < (long)pcVar17) {
          pcVar17 = (f.exception)->file;
        }
        pWVar19 = (WirePointer *)
                  (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)->ptr
                  + (long)pcVar17);
        pWVar15 = pWVar15 + 1;
        local_80 = f.exception;
        goto LAB_0017de1d;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                (&f_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                 "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                 (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 &_kjCondition,(char (*) [51])"Second word of double-far pad must be far pointer.");
    }
    pWVar19 = (WirePointer *)0x0;
    kj::_::Debug::Fault::~Fault(&f_3);
    pWVar15 = pWVar15 + 1;
LAB_0017de1d:
  } while (pWVar19 == (WirePointer *)0x0);
  uVar9 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
LAB_0017de2c:
  uVar9 = uVar9 & 3;
  _kjCondition.left = (int *)CONCAT44(1,uVar9);
  _kjCondition._8_8_ = (long)"() {\n  return which() == " + 0x15;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar9 == 1);
  if (uVar9 != 1) {
    this_00 = (DebugComparison<int_&,_int> *)&f;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
               ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                &_kjCondition,
               (char (*) [84])
               "Schema mismatch: Message contains non-list pointer where list pointer was expected."
              );
    goto LAB_0017e197;
  }
  uVar9 = (pWVar15->field_1).upper32Bits;
  EVar11 = (ElementSize)uVar9 & INLINE_COMPOSITE;
  if (EVar11 == INLINE_COMPOSITE) {
    f_3.exception._0_4_ = uVar9 >> 3;
    if (local_80 == (Exception *)0x0) {
LAB_0017e02e:
      uVar9 = (uint)*(uint64_t *)&(pWVar19->offsetAndKind).value & 3;
      _kjCondition.left = (int *)(ulong)uVar9;
      _kjCondition._8_8_ = (long)"() {\n  return which() == " + 0x15;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar9 == 0);
      if (uVar9 == 0) {
        uVar9 = (uint)*(uint64_t *)&(pWVar19->offsetAndKind).value >> 2 & 0x1fffffff;
        uVar12 = (ulong)uVar9;
        uVar13 = (uint)(pWVar19->field_1).structRef.ptrCount.value +
                 (uint)(pWVar19->field_1).structRef.dataSize.value;
        _kjCondition.left = (int *)(uVar13 * uVar12);
        _kjCondition._8_8_ = &f_3;
        _kjCondition.op.content.ptr = " <= ";
        piVar10 = (int *)(ulong)(uint)f_3.exception;
        _kjCondition.op.content.size_ = 5;
        bVar21 = (long)_kjCondition.left - (long)piVar10 == 0;
        _kjCondition.result = _kjCondition.left < piVar10 || bVar21;
        if (_kjCondition.left < piVar10 || bVar21) {
          if (uVar13 == 0) {
            if (local_80 == (Exception *)0x0) {
              local_80 = (Exception *)0x0;
            }
            else {
              uVar18 = (*(ReadLimiter **)&local_80->line)->limit;
              if (uVar18 < uVar12) {
                getListAnySize();
                goto LAB_0017daaf;
              }
              (*(ReadLimiter **)&local_80->line)->limit = uVar18 - uVar12;
            }
          }
          uVar1 = (pWVar19->field_1).structRef.dataSize.value;
          uVar2 = (pWVar19->field_1).structRef.ptrCount.value;
          __return_storage_ptr__->segment = (SegmentReader *)local_80;
          __return_storage_ptr__->capTable = pCVar5;
          __return_storage_ptr__->ptr = (byte *)(pWVar19 + 1);
          __return_storage_ptr__->elementCount = uVar9;
          __return_storage_ptr__->step = uVar13 * 0x40;
          __return_storage_ptr__->structDataSize = (uint)uVar1 << 6;
          __return_storage_ptr__->structPointerCount = uVar2;
          __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
code_r0x0017e129:
          __return_storage_ptr__->nestingLimit = local_74 + -1;
          return __return_storage_ptr__;
        }
        this_00 = (DebugComparison<int_&,_int> *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                   "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                   (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                   (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
      }
      else {
        this_00 = (DebugComparison<int_&,_int> *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                   (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   &_kjCondition,
                   (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
      }
      goto LAB_0017e197;
    }
    if ((char *)(((long)pWVar19 -
                  (long)((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr
                 >> 3) + (ulong)(uint)f_3.exception + 1) <= local_80->file) {
      uVar12 = (ulong)(uint)f_3.exception + 1;
      uVar18 = (*(ReadLimiter **)&local_80->line)->limit;
      if (uVar12 <= uVar18) {
        (*(ReadLimiter **)&local_80->line)->limit = uVar18 - uVar12;
        goto LAB_0017e02e;
      }
      (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
    }
    pcVar17 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
    iVar8 = 0x900;
  }
  else {
    SVar3 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar9 & 7) * 4);
    uVar12 = (ulong)(uVar9 >> 3);
    uVar13 = (uint)(EVar11 == POINTER) * 0x40 + SVar3;
    if (local_80 == (Exception *)0x0) {
LAB_0017e1aa:
      local_80 = (Exception *)0x0;
LAB_0017dfe3:
      __return_storage_ptr__->segment = (SegmentReader *)local_80;
      __return_storage_ptr__->capTable = pCVar5;
      __return_storage_ptr__->ptr = (byte *)pWVar19;
      __return_storage_ptr__->elementCount = uVar9 >> 3;
      __return_storage_ptr__->step = uVar13;
      __return_storage_ptr__->structDataSize = SVar3;
      __return_storage_ptr__->structPointerCount = (ushort)(EVar11 == POINTER);
      __return_storage_ptr__->elementSize = EVar11;
      goto code_r0x0017e129;
    }
    uVar18 = uVar13 * uVar12 + 0x3f >> 6 & 0xffffffff;
    if ((char *)(((long)pWVar19 -
                  (long)((ArrayPtr<const_capnp::word> *)&(local_80->ownFile).content.disposer)->ptr
                 >> 3) + uVar18) <= local_80->file) {
      uVar7 = (*(ReadLimiter **)&local_80->line)->limit;
      if (uVar18 <= uVar7) {
        (*(ReadLimiter **)&local_80->line)->limit = uVar7 - uVar18;
        if ((uVar9 & 7) == 0) {
          if (local_80 == (Exception *)0x0) goto LAB_0017e1aa;
          uVar18 = (*(ReadLimiter **)&local_80->line)->limit;
          if (uVar18 < uVar12) {
            getListAnySize();
            goto LAB_0017daaf;
          }
          (*(ReadLimiter **)&local_80->line)->limit = uVar18 - uVar12;
        }
        goto LAB_0017dfe3;
      }
      (*((Arena *)(local_80->ownFile).content.ptr)->_vptr_Arena[3])();
    }
    pcVar17 = "boundsCheck(segment, ptr, wordCount)";
    iVar8 = 0x958;
  }
  f.exception = f.exception & 0xffffffffffffff00;
  this_00 = &_kjCondition;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,iVar8,FAILED,pcVar17,
             "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
             ,(DebugExpression<bool> *)&f,
             (char (*) [319])
             "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
            );
LAB_0017e197:
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  goto LAB_0017daaf;
}

Assistant:

ListReader PointerReader::getListAnySize(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, ElementSize::VOID /* dummy */, nestingLimit, false);
}